

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O2

int llvm::detail::ilogb(double __x)

{
  byte bVar1;
  bool bVar2;
  int iVar3;
  IEEEFloat *in_RDI;
  IEEEFloat Normalized;
  IEEEFloat local_30;
  
  bVar1 = in_RDI->field_0x12 & 7;
  if ((in_RDI->field_0x12 & 7) == 0) {
    iVar3 = 0x7fffffff;
  }
  else if (bVar1 == 1) {
    iVar3 = -0x80000000;
  }
  else if (bVar1 == 3) {
    iVar3 = -0x7fffffff;
  }
  else {
    bVar2 = IEEEFloat::isDenormal(in_RDI);
    if (bVar2) {
      IEEEFloat::IEEEFloat(&local_30,in_RDI);
      iVar3 = in_RDI->semantics->precision - 1;
      local_30.exponent = local_30.exponent + (short)iVar3;
      IEEEFloat::normalize(&local_30,rmNearestTiesToEven,lfExactlyZero);
      iVar3 = local_30.exponent - iVar3;
      IEEEFloat::~IEEEFloat(&local_30);
    }
    else {
      iVar3 = (int)in_RDI->exponent;
    }
  }
  return iVar3;
}

Assistant:

int ilogb(const IEEEFloat &Arg) {
  if (Arg.isNaN())
    return IEEEFloat::IEK_NaN;
  if (Arg.isZero())
    return IEEEFloat::IEK_Zero;
  if (Arg.isInfinity())
    return IEEEFloat::IEK_Inf;
  if (!Arg.isDenormal())
    return Arg.exponent;

  IEEEFloat Normalized(Arg);
  int SignificandBits = Arg.getSemantics().precision - 1;

  Normalized.exponent += SignificandBits;
  Normalized.normalize(IEEEFloat::rmNearestTiesToEven, lfExactlyZero);
  return Normalized.exponent - SignificandBits;
}